

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void __thiscall QPDFJob::doJSONObjects(QPDFJob *this,Pipeline *p,bool *first,QPDF *pdf)

{
  qpdf_stream_decode_level_e decode_level;
  int version;
  qpdf_json_stream_data_e json_stream_data;
  element_type *peVar1;
  size_t sVar2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  wanted_objects;
  size_type sVar3;
  size_type sVar4;
  _Alloc_hider this_00;
  string key;
  set wanted_og;
  string local_c8;
  bool first_object;
  QPDFObjGen og;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1->json_version != 1) {
    wanted_og.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl
    .super__Rb_tree_header._M_header._M_left =
         &wanted_og.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
          _M_impl.super__Rb_tree_header._M_header;
    wanted_og.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl
    .super__Rb_tree_header._M_header._M_color = _S_red;
    wanted_og.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl
    .super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    wanted_og.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl
    .super__Rb_tree_header._M_node_count = 0;
    wanted_og.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl
    .super__Rb_tree_header._M_header._M_right =
         wanted_og.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
         _M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&key,"trailer",(allocator<char> *)&local_c8);
    sVar4 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&peVar1->json_objects,&key);
    std::__cxx11::string::~string((string *)&key);
    if (sVar4 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&key,"trailer",(allocator<char> *)&local_c8);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&wanted_og,&key);
      std::__cxx11::string::~string((string *)&key);
    }
    getWantedJSONObjects((set *)&key,this);
    for (; (size_type *)key.field_2._8_8_ != &key._M_string_length;
        key.field_2._8_8_ = std::_Rb_tree_increment(key.field_2._8_8_)) {
      og.obj = ((_Rb_tree_node_base *)(key.field_2._8_8_ + 0x20))->_M_color;
      og.gen = *(int *)&((_Rb_tree_node_base *)(key.field_2._8_8_ + 0x20))->field_0x4;
      QPDFObjGen::unparse_abi_cxx11_((string *)&first_object,&og,' ');
      std::operator+(&local_80,"obj:",(string *)&first_object);
      std::operator+(&local_c8,&local_80," R");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_emplace_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&wanted_og,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&first_object);
    }
    std::
    _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
    ::~_Rb_tree((_Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                 *)&key);
    peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    decode_level = peVar1->decode_level;
    version = peVar1->json_version;
    json_stream_data = peVar1->json_stream_data;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree(&local_60,
               (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&wanted_og);
    wanted_objects._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = 0x1641cb;
    wanted_objects._M_t._M_impl._0_8_ = &local_60;
    wanted_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)p;
    wanted_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)this;
    wanted_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)first;
    wanted_objects._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)key._M_dataplus._M_p;
    QPDF::writeJSON(pdf,version,p,false,first,decode_level,json_stream_data,
                    &peVar1->json_stream_prefix,wanted_objects);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_60);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&wanted_og);
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&wanted_og,"objects",(allocator<char> *)&key);
  JSON::writeDictionaryKey(p,first,(string *)&wanted_og,1);
  std::__cxx11::string::~string((string *)&wanted_og);
  first_object = true;
  JSON::writeDictionaryOpen(p,&first_object,1);
  sVar2 = *(size_t *)
           ((long)&(((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->json_objects)._M_t._M_impl.super__Rb_tree_header + 0x20);
  getWantedJSONObjects(&wanted_og,this);
  QPDF::getAllObjects((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&local_80,pdf);
  for (this_00._M_p = local_80._M_dataplus._M_p; this_00._M_p != (pointer)local_80._M_string_length;
      this_00._M_p = this_00._M_p + 0x10) {
    QPDFObjectHandle::unparse_abi_cxx11_(&key,(QPDFObjectHandle *)this_00._M_p);
    if (sVar2 == 0) {
LAB_00163ff5:
      QPDFObjectHandle::unparse_abi_cxx11_(&local_c8,(QPDFObjectHandle *)this_00._M_p);
      JSON::writeDictionaryKey(p,&first_object,&local_c8,2);
      std::__cxx11::string::~string((string *)&local_c8);
      QPDFObjectHandle::writeJSON((QPDFObjectHandle *)this_00._M_p,1,p,true,2);
      first_object = false;
    }
    else {
      local_c8._M_dataplus._M_p = (pointer)QPDFObjectHandle::getObjGen(this_00._M_p);
      sVar3 = std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::count
                        (&wanted_og.
                          super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,
                         (key_type *)&local_c8);
      if (sVar3 != 0) goto LAB_00163ff5;
    }
    std::__cxx11::string::~string((string *)&key);
  }
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&local_80);
  if (sVar2 != 0) {
    peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&key,"trailer",(allocator<char> *)&local_c8);
    sVar4 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&peVar1->json_objects,&key);
    std::__cxx11::string::~string((string *)&key);
    if (sVar4 == 0) goto LAB_001642f8;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&key,"trailer",(allocator<char> *)&local_c8);
  JSON::writeDictionaryKey(p,&first_object,&key,2);
  std::__cxx11::string::~string((string *)&key);
  QPDF::getTrailer((QPDF *)&key);
  QPDFObjectHandle::writeJSON((QPDFObjectHandle *)&key,1,p,true,2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&key._M_string_length);
  first_object = false;
LAB_001642f8:
  JSON::writeDictionaryClose(p,(bool)(first_object & 1),1);
  std::
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  ::~_Rb_tree((_Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
               *)&wanted_og);
  return;
}

Assistant:

void
QPDFJob::doJSONObjects(Pipeline* p, bool& first, QPDF& pdf)
{
    if (m->json_version == 1) {
        JSON::writeDictionaryKey(p, first, "objects", 1);
        bool first_object = true;
        JSON::writeDictionaryOpen(p, first_object, 1);
        bool all_objects = m->json_objects.empty();
        auto wanted_og = getWantedJSONObjects();
        for (auto& obj: pdf.getAllObjects()) {
            std::string key = obj.unparse();

            if (all_objects || wanted_og.count(obj.getObjGen())) {
                JSON::writeDictionaryKey(p, first_object, obj.unparse(), 2);
                obj.writeJSON(1, p, true, 2);
                first_object = false;
            }
        }
        if (all_objects || m->json_objects.count("trailer")) {
            JSON::writeDictionaryKey(p, first_object, "trailer", 2);
            pdf.getTrailer().writeJSON(1, p, true, 2);
            first_object = false;
        }
        JSON::writeDictionaryClose(p, first_object, 1);
    } else {
        std::set<std::string> json_objects;
        if (m->json_objects.count("trailer")) {
            json_objects.insert("trailer");
        }
        for (auto og: getWantedJSONObjects()) {
            json_objects.emplace("obj:" + og.unparse(' ') + " R");
        }
        pdf.writeJSON(
            m->json_version,
            p,
            false,
            first,
            m->decode_level,
            m->json_stream_data,
            m->json_stream_prefix,
            json_objects);
    }
}